

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFanio.c
# Opt level: O0

void Nwk_ObjDeleteFanin(Nwk_Obj_t *pObj,Nwk_Obj_t *pFanin)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int fFound;
  int Limit;
  int k;
  int i;
  Nwk_Obj_t *pFanin_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = pObj->nFanins;
  iVar2 = pObj->nFanouts;
  bVar3 = false;
  fFound = 0;
  for (Limit = 0; Limit < iVar1 + iVar2; Limit = Limit + 1) {
    if ((bVar3) || (pObj->pFanio[Limit] != pFanin)) {
      pObj->pFanio[fFound] = pObj->pFanio[Limit];
      fFound = fFound + 1;
    }
    else {
      bVar3 = true;
    }
  }
  if (Limit == fFound + 1) {
    pObj->nFanins = pObj->nFanins + -1;
    iVar1 = pFanin->nFanins;
    iVar2 = pFanin->nFanouts;
    bVar3 = false;
    fFound = pFanin->nFanins;
    for (Limit = fFound; Limit < iVar1 + iVar2; Limit = Limit + 1) {
      if ((bVar3) || (pFanin->pFanio[Limit] != pObj)) {
        pFanin->pFanio[fFound] = pFanin->pFanio[Limit];
        fFound = fFound + 1;
      }
      else {
        bVar3 = true;
      }
    }
    if (Limit == fFound + 1) {
      pFanin->nFanouts = pFanin->nFanouts + -1;
      return;
    }
    __assert_fail("i == k + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                  ,0xd5,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
  }
  __assert_fail("i == k + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkFanio.c"
                ,0xcb,"void Nwk_ObjDeleteFanin(Nwk_Obj_t *, Nwk_Obj_t *)");
}

Assistant:

void Nwk_ObjDeleteFanin( Nwk_Obj_t * pObj, Nwk_Obj_t * pFanin )
{
    int i, k, Limit, fFound;
    // remove pFanin from the fanin list of pObj
    Limit = pObj->nFanins + pObj->nFanouts;
    fFound = 0;
    for ( k = i = 0; i < Limit; i++ )
        if ( fFound || pObj->pFanio[i] != pFanin )
            pObj->pFanio[k++] = pObj->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanin
    pObj->nFanins--;
    // remove pObj from the fanout list of pFanin
    Limit = pFanin->nFanins + pFanin->nFanouts;
    fFound = 0;
    for ( k = i = pFanin->nFanins; i < Limit; i++ )
        if ( fFound || pFanin->pFanio[i] != pObj )
            pFanin->pFanio[k++] = pFanin->pFanio[i];
        else
            fFound = 1;
    assert( i == k + 1 ); // if it fails, likely because of duplicated fanout
    pFanin->nFanouts--; 
}